

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::DataParameter::ByteSizeLong(DataParameter *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->source_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar2 = ((this->mean_file_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      uVar6 = this->batch_size_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 8) != 0) {
      uVar6 = this->crop_size_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x10) != 0) {
      uVar6 = this->rand_skip_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    sVar4 = ((uVar5 >> 5 & 2) + (uVar5 >> 4 & 2)) + sVar4;
    if ((char)uVar5 < '\0') {
      if (this->backend_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->backend_ | 1;
        iVar3 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar7 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar7;
    }
  }
  if ((uVar5 & 0x300) != 0) {
    if ((uVar5 >> 8 & 1) != 0) {
      sVar4 = sVar4 + 5;
    }
    if ((uVar5 >> 9 & 1) != 0) {
      uVar5 = this->prefetch_ | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t DataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.DataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string source = 1;
    if (has_source()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string mean_file = 3;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional uint32 batch_size = 4;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 crop_size = 5 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional uint32 rand_skip = 7 [default = 0];
    if (has_rand_skip()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->rand_skip());
    }

    // optional bool mirror = 6 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool force_encoded_color = 9 [default = false];
    if (has_force_encoded_color()) {
      total_size += 1 + 1;
    }

    // optional .caffe.DataParameter.DB backend = 8 [default = LEVELDB];
    if (has_backend()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->backend());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

    // optional uint32 prefetch = 10 [default = 4];
    if (has_prefetch()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->prefetch());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}